

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

green_poller_t green_poller_init(green_loop_t loop,size_t size)

{
  void *pvVar1;
  green_poller_t poller;
  size_t size_local;
  green_loop_t loop_local;
  
  if ((loop == (green_loop_t)0x0) || (size == 0)) {
    loop_local = (green_loop_t)0x0;
  }
  else {
    if (loop->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x17c);
      fflush(_stderr);
      abort();
    }
    loop_local = (green_loop_t)green_malloc(0x30);
    *(green_loop_t *)loop_local = loop;
    loop_local->nextcoroid = 1;
    pvVar1 = green_malloc((int)(size << 3));
    (loop_local->context).__uc_flags = (unsigned_long)pvVar1;
    (loop_local->context).uc_stack.ss_sp = (void *)size;
  }
  return (green_poller_t)loop_local;
}

Assistant:

green_poller_t green_poller_init(green_loop_t loop, size_t size)
{
    if ((loop == NULL) || (size == 0)) {
        return NULL;
    }
    green_assert(loop->refs > 0);

    green_poller_t poller = green_malloc(sizeof(struct green_poller));
    poller->loop = loop;
    poller->refs = 1;
    poller->futures = green_malloc(size * sizeof(green_future_t));
    poller->size = size;

    return poller;
}